

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall V4L2Device::init_buffers(V4L2Device *this)

{
  int iVar1;
  int *piVar2;
  reference pvVar3;
  int *in_RDI;
  int i;
  v4l2_buffer bufferinfo;
  v4l2_requestbuffers bufrequest;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 uVar4;
  undefined2 in_stack_fffffffffffffd9c;
  DispatchAction in_stack_fffffffffffffd9e;
  Writer *in_stack_fffffffffffffda0;
  LineNumber in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  Writer *pWVar5;
  undefined8 in_stack_fffffffffffffdb8;
  Writer *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdd0;
  Writer local_1f8;
  char *local_188;
  Writer local_180;
  int local_10c;
  int local_108 [10];
  uint local_c8;
  uint local_c0;
  Writer local_98;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  bool local_1;
  
  memset(&local_24,0,0x14);
  local_20 = 1;
  local_1c = 1;
  local_24 = 0x20;
  iVar1 = ioctl(*in_RDI,0xc0145608,&local_24);
  if (iVar1 < 0) {
    uVar4 = 0;
    el::base::Writer::Writer
              (in_stack_fffffffffffffdc0,(Level)((ulong)in_stack_fffffffffffffdb8 >> 0x30),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0
               ,in_stack_fffffffffffffd9e,(VerboseLevel)in_stack_fffffffffffffdd0);
    el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffda0,
               (char (*) [24])
               CONCAT26(in_stack_fffffffffffffd9e,CONCAT24(in_stack_fffffffffffffd9c,uVar4)));
    piVar2 = __errno_location();
    strerror(*piVar2);
    el::base::Writer::operator<<
              (in_stack_fffffffffffffda0,
               (char **)CONCAT26(in_stack_fffffffffffffd9e,CONCAT24(in_stack_fffffffffffffd9c,uVar4)
                                ));
    el::base::Writer::~Writer(in_stack_fffffffffffffda0);
    local_1 = false;
  }
  else {
    for (local_10c = 0; local_10c < 0x20; local_10c = local_10c + 1) {
      memset(local_108,0,0x58);
      local_108[1] = 1;
      local_108[0] = local_10c;
      iVar1 = ioctl(*in_RDI,0xc0585609,local_108);
      if (iVar1 < 0) {
        uVar4 = 0;
        pWVar5 = &local_180;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffdc0,(Level)((ulong)in_stack_fffffffffffffdb8 >> 0x30),
                   in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                   (char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9e,(VerboseLevel)pWVar5)
        ;
        el::base::Writer::construct(pWVar5,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffffda0,
                   (char (*) [25])
                   CONCAT26(in_stack_fffffffffffffd9e,CONCAT24(in_stack_fffffffffffffd9c,uVar4)));
        piVar2 = __errno_location();
        local_188 = strerror(*piVar2);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffffda0,
                   (char **)CONCAT26(in_stack_fffffffffffffd9e,
                                     CONCAT24(in_stack_fffffffffffffd9c,uVar4)));
        el::base::Writer::~Writer(in_stack_fffffffffffffda0);
        return false;
      }
      in_stack_fffffffffffffdc0 =
           (Writer *)mmap((void *)0x0,(ulong)local_c0,3,1,*in_RDI,(ulong)local_c8);
      pvVar3 = std::array<V4L2Device::IOBuffer,_32UL>::operator[]
                         ((array<V4L2Device::IOBuffer,_32UL> *)in_stack_fffffffffffffda0,
                          CONCAT26(in_stack_fffffffffffffd9e,
                                   CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)));
      pvVar3->start = in_stack_fffffffffffffdc0;
      pvVar3 = std::array<V4L2Device::IOBuffer,_32UL>::operator[]
                         ((array<V4L2Device::IOBuffer,_32UL> *)in_stack_fffffffffffffda0,
                          CONCAT26(in_stack_fffffffffffffd9e,
                                   CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)));
      if (pvVar3->start == (void *)0xffffffffffffffff) {
        uVar4 = 0;
        pWVar5 = &local_1f8;
        el::base::Writer::Writer
                  (in_stack_fffffffffffffdc0,(Level)((ulong)in_stack_fffffffffffffdb8 >> 0x30),
                   (char *)pWVar5,in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                   in_stack_fffffffffffffd9e,(VerboseLevel)in_stack_fffffffffffffdd0);
        el::base::Writer::construct(pWVar5,1,el::base::consts::kDefaultLoggerId);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffffda0,
                   (char (*) [24])
                   CONCAT26(in_stack_fffffffffffffd9e,CONCAT24(in_stack_fffffffffffffd9c,uVar4)));
        piVar2 = __errno_location();
        strerror(*piVar2);
        el::base::Writer::operator<<
                  (in_stack_fffffffffffffda0,
                   (char **)CONCAT26(in_stack_fffffffffffffd9e,
                                     CONCAT24(in_stack_fffffffffffffd9c,uVar4)));
        el::base::Writer::~Writer(in_stack_fffffffffffffda0);
        return false;
      }
      in_stack_fffffffffffffda0 = (Writer *)(ulong)local_c0;
      pvVar3 = std::array<V4L2Device::IOBuffer,_32UL>::operator[]
                         ((array<V4L2Device::IOBuffer,_32UL> *)in_stack_fffffffffffffda0,
                          CONCAT26(in_stack_fffffffffffffd9e,
                                   CONCAT24(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)));
      pvVar3->size = (size_t)in_stack_fffffffffffffda0;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
    init_buffers()
    {
        struct v4l2_requestbuffers bufrequest;
        std::memset(&bufrequest, 0, sizeof(bufrequest));

        bufrequest.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        bufrequest.memory = V4L2_MEMORY_MMAP;
        bufrequest.count = kBuffersCount;

        if (ioctl(fd, VIDIOC_REQBUFS, &bufrequest) < 0) {
            LOG(ERROR) << "VIDIOC_REQBUFS failed: " << strerror(errno);
            return false;
        }

        struct v4l2_buffer bufferinfo;

        for (int i = 0; i < kBuffersCount; i++) {
            std::memset(&bufferinfo, 0, sizeof(bufferinfo));

            bufferinfo.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
            bufferinfo.memory = V4L2_MEMORY_MMAP;
            bufferinfo.index = i;

            if (ioctl(fd, VIDIOC_QUERYBUF, &bufferinfo) < 0) {
                LOG(ERROR) << "VIDIOC_QUERYBUF failed: " << strerror(errno);
                return false;
            }

            buffers[i].start = mmap(NULL, bufferinfo.length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, bufferinfo.m.offset);
            if (buffers[i].start == MAP_FAILED) {
                LOG(ERROR) << "mmaping buffer failed: " << strerror(errno);
                return false;
            }

            buffers[i].size = bufferinfo.length;
        }

        return true;
    }